

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_334836::sessionFIX40Fixture::createSession
          (sessionFIX40Fixture *this,int heartBtInt,int startDay,int endDay)

{
  Session *pSVar1;
  allocator<char> local_70c;
  allocator<char> local_70b;
  allocator<char> local_70a;
  allocator<char> local_709;
  STRING local_708;
  STRING local_6e8;
  string local_6c8;
  STRING local_6a8;
  _Any_data local_688;
  code *local_678;
  code *local_670;
  FieldBase local_668;
  TimeRange sessionTime;
  string local_600 [2];
  SessionID sessionID;
  DataDictionaryProvider provider;
  
  if (this->object != (Session *)0x0) {
    (**(code **)(*(long *)this->object + 8))();
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_708,"FIX.4.0",&local_709);
  FIX::BeginString::BeginString((BeginString *)&provider,&local_708);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e8,"TW",&local_70a);
  FIX::SenderCompID::SenderCompID((SenderCompID *)&sessionTime,&local_6e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a8,"ISLD",&local_70b);
  FIX::TargetCompID::TargetCompID((TargetCompID *)&local_668,&local_6a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c8,"",&local_70c);
  FIX::SessionID::SessionID
            (&sessionID,
             (string *)
             &provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_parent,local_600,&local_668.m_string,&local_6c8);
  std::__cxx11::string::~string((string *)&local_6c8);
  FIX::FieldBase::~FieldBase(&local_668);
  std::__cxx11::string::~string((string *)&local_6a8);
  FIX::FieldBase::~FieldBase((FieldBase *)&sessionTime);
  std::__cxx11::string::~string((string *)&local_6e8);
  FIX::FieldBase::~FieldBase((FieldBase *)&provider);
  std::__cxx11::string::~string((string *)&local_708);
  FIX::TimeRange::TimeRange
            (&sessionTime,&(this->super_TestCallback).startTime,&(this->super_TestCallback).endTime,
             startDay,endDay);
  FIX::DataDictionaryProvider::DataDictionaryProvider(&provider);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_708,"FIX40",(allocator<char> *)&local_6e8);
  FIX::TestSettings::pathForSpec((string *)&local_668,&local_708);
  FIX::DataDictionaryProvider::addTransportDataDictionary
            (&provider,&sessionID.m_beginString,(string *)&local_668);
  std::__cxx11::string::~string((string *)&local_668);
  std::__cxx11::string::~string((string *)&local_708);
  pSVar1 = (Session *)operator_new(0x878);
  local_688._8_8_ = 0;
  local_670 = std::
              _Function_handler<FIX::UtcTimeStamp_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/SessionTestCase.cpp:580:26)>
              ::_M_invoke;
  local_678 = std::
              _Function_handler<FIX::UtcTimeStamp_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/SessionTestCase.cpp:580:26)>
              ::_M_manager;
  local_688._M_unused._M_object = this;
  FIX::Session::Session
            (pSVar1,&local_688,&(this->super_TestCallback).super_NullApplication,&this->factory,
             &sessionID,&provider,&sessionTime,heartBtInt,0);
  this->object = pSVar1;
  std::_Function_base::~_Function_base((_Function_base *)&local_688);
  FIX::Session::setResponder(this->object,(Responder *)this);
  FIX::DataDictionaryProvider::~DataDictionaryProvider(&provider);
  FIX::SessionID::~SessionID(&sessionID);
  return;
}

Assistant:

virtual void createSession(int heartBtInt, int startDay = -1, int endDay = -1) {
    if (object) {
      delete object;
    }

    SessionID sessionID(BeginString("FIX.4.0"), SenderCompID("TW"), TargetCompID("ISLD"));
    TimeRange sessionTime(startTime, endTime, startDay, endDay);

    DataDictionaryProvider provider;
    provider.addTransportDataDictionary(sessionID.getBeginString(), FIX::TestSettings::pathForSpec("FIX40"));

    object = new Session([this]() { return now; }, *this, factory, sessionID, provider, sessionTime, heartBtInt, 0);
    object->setResponder(this);
  }